

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

GCstr * lj_parse_keepstr(LexState *ls,char *str,size_t len)

{
  lua_State *L;
  GCstr *key;
  TValue *pTVar1;
  ulong uVar2;
  
  L = ls->L;
  key = lj_str_new(L,str,len);
  pTVar1 = lj_tab_setstr(L,ls->fs->kt,key);
  if ((pTVar1->field_2).it == 0xffffffff) {
    (pTVar1->field_2).it = 0xfffffffd;
  }
  uVar2 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar2 + 0x54) <= *(uint *)(uVar2 + 0x50)) {
    lj_gc_step(L);
  }
  return key;
}

Assistant:

GCstr *lj_parse_keepstr(LexState *ls, const char *str, size_t len)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  GCstr *s = lj_str_new(L, str, len);
  TValue *tv = lj_tab_setstr(L, ls->fs->kt, s);
  if (tvisnil(tv)) setboolV(tv, 1);
  lj_gc_check(L);
  return s;
}